

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O0

float f__cabs(float real,float imag)

{
  float fVar1;
  double dVar2;
  undefined4 local_14;
  float temp;
  float imag_local;
  float real_local;
  
  temp = real;
  if (real < 0.0) {
    temp = -real;
  }
  fVar1 = temp;
  local_14 = imag;
  if (imag < 0.0) {
    local_14 = -imag;
  }
  if (temp < local_14) {
    temp = local_14;
    local_14 = fVar1;
  }
  if ((local_14 + temp != temp) || (NAN(local_14 + temp) || NAN(temp))) {
    dVar2 = sqrt((double)((local_14 / temp) * (local_14 / temp)) + 1.0);
    imag_local = (float)((double)temp * dVar2);
  }
  else {
    imag_local = temp;
  }
  return imag_local;
}

Assistant:

float
f__cabs(float real, float imag)
#endif
{
    float temp;

    if (real < 0)
        real = -real;
    if (imag < 0)
        imag = -imag;
    if (imag > real) {
        temp = real;
        real = imag;
        imag = temp;
    }
    if ((imag + real) == real)
        return ((float) real);

    temp = imag / real;
    temp = real * sqrt(1.0 + temp * temp);      /*overflow!! */
    return (temp);
}